

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void ssh1_compute_session_id(uchar *session_id,uchar *cookie,RSAKey *hostkey,RSAKey *servkey)

{
  BinarySink *pBVar1;
  uint8_t uVar2;
  ssh_hash *h;
  size_t sVar3;
  ulong local_40;
  size_t i_1;
  size_t i;
  ssh_hash *hash;
  RSAKey *servkey_local;
  RSAKey *hostkey_local;
  uchar *cookie_local;
  uchar *session_id_local;
  
  h = ssh_hash_new(&ssh_md5);
  sVar3 = mp_get_nbits(hostkey->modulus);
  i_1 = sVar3 + 7 >> 3;
  while (i_1 != 0) {
    pBVar1 = h->binarysink_;
    uVar2 = mp_get_byte(hostkey->modulus,i_1 - 1);
    BinarySink_put_byte(pBVar1,uVar2);
    i_1 = i_1 - 1;
  }
  sVar3 = mp_get_nbits(servkey->modulus);
  local_40 = sVar3 + 7 >> 3;
  while (local_40 != 0) {
    pBVar1 = h->binarysink_;
    uVar2 = mp_get_byte(servkey->modulus,local_40 - 1);
    BinarySink_put_byte(pBVar1,uVar2);
    local_40 = local_40 - 1;
  }
  BinarySink_put_data(h->binarysink_,cookie,8);
  ssh_hash_final(h,session_id);
  return;
}

Assistant:

void ssh1_compute_session_id(
    unsigned char *session_id, const unsigned char *cookie,
    RSAKey *hostkey, RSAKey *servkey)
{
    ssh_hash *hash = ssh_hash_new(&ssh_md5);

    for (size_t i = (mp_get_nbits(hostkey->modulus) + 7) / 8; i-- ;)
        put_byte(hash, mp_get_byte(hostkey->modulus, i));
    for (size_t i = (mp_get_nbits(servkey->modulus) + 7) / 8; i-- ;)
        put_byte(hash, mp_get_byte(servkey->modulus, i));
    put_data(hash, cookie, 8);
    ssh_hash_final(hash, session_id);
}